

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  int iVar1;
  ImFontGlyph *__src;
  ImFontAtlas *pIVar2;
  ImFontGlyph *__dest;
  int iVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  
  if (cfg != (ImFontConfig *)0x0) {
    fVar6 = cfg->GlyphMaxAdvanceX;
    if (advance_x <= cfg->GlyphMaxAdvanceX) {
      fVar6 = advance_x;
    }
    uVar5 = -(uint)(advance_x < cfg->GlyphMinAdvanceX);
    fVar6 = (float)(uVar5 & (uint)cfg->GlyphMinAdvanceX | ~uVar5 & (uint)fVar6);
    if ((fVar6 != advance_x) || (NAN(fVar6) || NAN(advance_x))) {
      fVar7 = (fVar6 - advance_x) * 0.5;
      if ((cfg->PixelSnapH & 1U) != 0) {
        fVar7 = (float)(int)fVar7;
      }
      x0 = x0 + fVar7;
      x1 = x1 + fVar7;
    }
    if ((cfg->PixelSnapH & 1U) != 0) {
      fVar6 = (float)(int)(fVar6 + 0.5);
    }
    advance_x = fVar6 + (cfg->GlyphExtraSpacing).x;
  }
  iVar1 = (this->Glyphs).Size;
  iVar4 = iVar1 + 1;
  iVar3 = (this->Glyphs).Capacity;
  if (iVar1 < iVar3) {
    __dest = (this->Glyphs).Data;
  }
  else {
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
    __dest = (ImFontGlyph *)ImGui::MemAlloc((long)iVar3 * 0x28);
    __src = (this->Glyphs).Data;
    if (__src != (ImFontGlyph *)0x0) {
      memcpy(__dest,__src,(long)(this->Glyphs).Size * 0x28);
      ImGui::MemFree((this->Glyphs).Data);
    }
    (this->Glyphs).Data = __dest;
    (this->Glyphs).Capacity = iVar3;
  }
  (this->Glyphs).Size = iVar4;
  *(uint *)(__dest + iVar1) = (uint)(y0 != y1 && x0 != x1) * -0x80000000 | (uint)codepoint;
  __dest[iVar1].X0 = x0;
  __dest[iVar1].Y0 = y0;
  __dest[iVar1].X1 = x1;
  __dest[iVar1].Y1 = y1;
  __dest[iVar1].U0 = u0;
  __dest[iVar1].V0 = v0;
  __dest[iVar1].U1 = u1;
  __dest[iVar1].V1 = v1;
  __dest[iVar1].AdvanceX = advance_x;
  pIVar2 = this->ContainerAtlas;
  fVar6 = (float)pIVar2->TexGlyphPadding + 0.99;
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((float)pIVar2->TexHeight * (v1 - v0) + fVar6) *
       (int)((float)pIVar2->TexWidth * (u1 - u0) + fVar6);
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}